

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# desugarer.cpp
# Opt level: O0

Apply * __thiscall
jsonnet::internal::Desugarer::primitiveEquals(Desugarer *this,LocationRange *loc,AST *a,AST *b)

{
  Apply *pAVar1;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *in_RDI;
  AST *in_stack_00000138;
  AST *in_stack_00000140;
  UString *in_stack_00000148;
  LocationRange *in_stack_00000150;
  Desugarer *in_stack_00000158;
  allocator<char32_t> *in_stack_ffffffffffffffc0;
  char32_t *in_stack_ffffffffffffffc8;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
  *in_stack_ffffffffffffffd0;
  
  ::std::allocator<char32_t>::allocator((allocator<char32_t> *)0x2b3ceb);
  ::std::__cxx11::u32string::u32string<std::allocator<char32_t>>
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  pAVar1 = stdFunc(in_stack_00000158,in_stack_00000150,in_stack_00000148,in_stack_00000140,
                   in_stack_00000138);
  ::std::__cxx11::u32string::~u32string(in_RDI);
  ::std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x2b3d3b);
  return pAVar1;
}

Assistant:

Apply *primitiveEquals(const LocationRange &loc, AST *a, AST *b)
    {
        return stdFunc(loc, U"primitiveEquals", a, b);
    }